

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_mels.c
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  N_Vector y;
  long *plVar5;
  char *pcVar6;
  double dVar7;
  sunrealtype rtol;
  sunrealtype in_XMM2_Qa;
  void *arkode_mem;
  sunrealtype t;
  SUNContext ctx;
  sunrealtype lamda;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  long local_a0;
  double local_98;
  undefined8 local_90;
  undefined8 local_88;
  double local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  local_88 = 0xc059000000000000;
  local_a0 = 0;
  uVar3 = SUNContext_Create(0,&local_90);
  if ((int)uVar3 < 0) {
    pcVar6 = "SUNContext_Create";
  }
  else {
    puts("\nAnalytical ODE test problem:");
    printf("    lamda = %g\n",local_88);
    printf("   reltol = %.1e\n",0x3eb0c6f7a0b5ed8d);
    printf("   abstol = %.1e\n\n",0x3ddb7cdfd9d7bdbb);
    y = (N_Vector)N_VNew_Serial(1,local_90);
    if (y == (N_Vector)0x0) {
      main_cold_3();
      return 1;
    }
    N_VConst(0,y);
    local_a0 = ARKStepCreate(0,0,f,y,local_90);
    if (local_a0 == 0) {
      main_cold_2();
      return 1;
    }
    uVar3 = ARKodeSetUserData(local_a0,&local_88);
    if ((int)uVar3 < 0) {
      pcVar6 = "ARKodeSetUserData";
    }
    else {
      rtol = 1e-10;
      uVar3 = ARKodeSStolerances(0x3eb0c6f7a0b5ed8d,local_a0);
      lVar2 = local_a0;
      if ((int)uVar3 < 0) {
        pcVar6 = "ARKodeSStolerances";
      }
      else {
        plVar5 = (long *)SUNLinSolNewEmpty(local_90);
        if (plVar5 == (long *)0x0) {
          plVar5 = (long *)0x0;
        }
        else {
          puVar1 = (undefined8 *)plVar5[1];
          *puVar1 = MatrixEmbeddedLSType;
          puVar1[8] = MatrixEmbeddedLSSolve;
          puVar1[0xe] = MatrixEmbeddedLSFree;
          *plVar5 = lVar2;
        }
        if (plVar5 == (long *)0x0) {
          main_cold_1();
          return 1;
        }
        uVar3 = ARKodeSetLinearSolver(local_a0,plVar5,0);
        if ((int)uVar3 < 0) {
          pcVar6 = "ARKodeSetLinearSolver";
        }
        else {
          uVar3 = ARKodeSetLinear(local_a0,0);
          if (-1 < (int)uVar3) {
            local_98 = 0.0;
            puts("        t           u");
            puts("   ---------------------");
            if (1e-15 < 10.0 - local_98) {
              dVar7 = 1.0;
              do {
                local_80 = dVar7;
                uVar3 = ARKodeEvolve(local_a0,y,&local_98,1);
                if ((int)uVar3 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeEvolve",
                          (ulong)uVar3);
                  break;
                }
                printf("  %10.6f  %10.6f\n",local_98,**(undefined8 **)((long)y->content + 0x10));
                in_XMM2_Qa = local_80 + 1.0;
                rtol = 10.0 - local_98;
                dVar7 = 10.0;
                if (in_XMM2_Qa <= 10.0) {
                  dVar7 = in_XMM2_Qa;
                }
              } while (1e-15 < rtol);
            }
            puts("   ---------------------");
            uVar3 = ARKodeGetNumSteps(local_a0,&local_30);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetNumSteps"
                      ,(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumStepAttempts(local_a0,&local_38);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumStepAttempts",(ulong)uVar3);
            }
            uVar3 = ARKStepGetNumRhsEvals(local_a0,&local_40,&local_48);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKStepGetNumRhsEvals",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumLinSolvSetups(local_a0,&local_50);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumLinSolvSetups",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumErrTestFails(local_a0,&local_78);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumErrTestFails",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumNonlinSolvIters(local_a0,&local_68);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumNonlinSolvIters",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumNonlinSolvConvFails(local_a0,&local_70);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumNonlinSolvConvFails",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumJacEvals(local_a0,&local_58);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumJacEvals",(ulong)uVar3);
            }
            uVar3 = ARKodeGetNumLinRhsEvals(local_a0,&local_60);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumLinRhsEvals",(ulong)uVar3);
            }
            puts("\nFinal Solver Statistics:");
            printf("   Internal solver steps = %li (attempted = %li)\n",local_30,local_38);
            printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_40,local_48);
            printf("   Total linear solver setups = %li\n",local_50);
            printf("   Total RHS evals for setting up the linear system = %li\n",local_60);
            printf("   Total number of Jacobian evaluations = %li\n",local_58);
            printf("   Total number of Newton iterations = %li\n",local_68);
            printf("   Total number of linear solver convergence failures = %li\n",local_70);
            printf("   Total number of error test failures = %li\n\n",local_78);
            iVar4 = check_ans(y,local_98,rtol,in_XMM2_Qa);
            N_VDestroy(y);
            ARKodeFree(&local_a0);
            SUNLinSolFree(plVar5);
            SUNContext_Free(&local_90);
            return iVar4;
          }
          pcVar6 = "ARKodeSetLinear";
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar6,(ulong)uVar3);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);   /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);    /* time between outputs */
  sunindextype NEQ   = 1;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunrealtype lamda  = SUN_RCONST(-100.0); /* stiffness parameter */

  /* general problem variables */
  int retval;                /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKODE memory structure */
  sunrealtype t, tout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Initial diagnostics output */
  printf("\nAnalytical ODE test problem:\n");
  printf("    lamda = %" GSYM "\n", lamda);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(0.0), y); /* Specify initial condition */

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_retval((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  retval = ARKodeSetUserData(arkode_mem,
                             (void*)&lamda); /* Pass lamda to user functions */
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }
  retval = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_retval(&retval, "ARKodeSStolerances", 1)) { return 1; }

  /* Initialize custom matrix-embedded linear solver */
  LS = MatrixEmbeddedLS(arkode_mem, ctx);
  if (check_retval((void*)LS, "MatrixEmbeddedLS", 0)) { return 1; }
  retval = ARKodeSetLinearSolver(arkode_mem, LS, NULL); /* Attach linear solver */
  if (check_retval(&retval, "ARKodeSetLinearSolver", 1)) { return 1; }

  /* Specify linearly implicit RHS, with non-time-dependent Jacobian */
  retval = ARKodeSetLinear(arkode_mem, 0);
  if (check_retval(&retval, "ARKodeSetLinear", 1)) { return 1; }

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached. */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    if (retval >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");

  /* Get/print some final statistics on how the solve progressed */
  retval = ARKodeGetNumSteps(arkode_mem, &nst);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_retval(&retval, "ARKodeGetNumStepAttempts", 1);
  retval = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_retval(&retval, "ARKStepGetNumRhsEvals", 1);
  retval = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_retval(&retval, "ARKodeGetNumLinSolvSetups", 1);
  retval = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_retval(&retval, "ARKodeGetNumErrTestFails", 1);
  retval = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_retval(&retval, "ARKodeGetNumNonlinSolvIters", 1);
  retval = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_retval(&retval, "ARKodeGetNumNonlinSolvConvFails", 1);
  retval = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_retval(&retval, "ARKodeGetNumJacEvals", 1);
  retval = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_retval(&retval, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of linear solver convergence failures = %li\n", ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* check the solution error */
  retval = check_ans(y, t, reltol, abstol);

  /* Clean up and return */
  N_VDestroy(y);           /* Free y vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNContext_Free(&ctx);   /* Free the SUNContext */

  return retval;
}